

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedOutputStreamTest.cpp
# Opt level: O1

int BufferedOutputStreamTest(int argc,char **argv)

{
  OutputBufferedStream *this;
  OutputFileStream *this_00;
  Byte buffer [5];
  allocator<char> local_109;
  PosixPath local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  FileURL local_88;
  FileURL local_68;
  FileURL local_48;
  
  this = (OutputBufferedStream *)operator_new(0x28);
  this_00 = (OutputFileStream *)operator_new(0x10);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"BufferedOutputStreamTest.txt","");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,argv[2],&local_109);
  PosixPath::PosixPath(&local_108,&local_a8);
  PosixPath::ToFileURL(&local_88,&local_108);
  PosixPath::~PosixPath(&local_108);
  FileURL::FileURL(&local_68,&local_e8);
  FileURL::InterpretFrom(&local_48,&local_68,&local_88);
  PosixPath::PosixPath(&local_108);
  PosixPath::FromFileURL(&local_108,&local_48);
  PosixPath::ToString_abi_cxx11_(&local_c8,&local_108);
  PosixPath::~PosixPath(&local_108);
  FileURL::~FileURL(&local_48);
  FileURL::~FileURL(&local_68);
  FileURL::~FileURL(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  OutputFileStream::OutputFileStream(this_00,&local_c8,false);
  OutputBufferedStream::OutputBufferedStream(this,(IByteWriterWithPosition *)this_00,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._4_1_ = 0x65;
  local_108.mIsAbsolute = true;
  local_108._1_3_ = 0x646362;
  (*(this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter[2])(this,&local_108,5)
  ;
  (*(this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter[1])(this);
  return 0;
}

Assistant:

int BufferedOutputStreamTest(int argc, char* argv[])
{
	IByteWriter* stream = new OutputBufferedStream(new OutputFileStream(
                            BuildRelativeOutputPath(argv,"BufferedOutputStreamTest.txt")),2);
	Byte buffer[5] = {'a','b','c','d','e'};

	stream->Write(buffer,5);
	delete stream;

	return 0;
}